

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O0

string * __thiscall antlr::ANTLRException::getMessage_abi_cxx11_(ANTLRException *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

string getMessage() const
	{
		return text;
	}